

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryRemove(InMemoryDirectory *this,PathPtr path)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  size_t *psVar1;
  size_t sVar2;
  undefined1 uVar3;
  int iVar4;
  iterator iVar5;
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
  *this_01;
  undefined4 extraout_var;
  size_t sVar6;
  char *pcVar7;
  undefined8 extraout_RDX;
  String *pSVar8;
  _Link_type __p;
  StringPtr name;
  Fault f;
  undefined1 local_48 [16];
  key_type local_38;
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  if (sVar6 == 1) {
    this_00 = &this->impl;
    _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    local_48._8_8_ = &(this->impl).value;
    local_38.content.size_ = (pSVar8->content).size_;
    if (local_38.content.size_ == 0) {
      local_38.content.ptr = "";
    }
    else {
      local_38.content.ptr = (pSVar8->content).ptr;
    }
    local_38.content.size_ = local_38.content.size_ + (local_38.content.size_ == 0);
    local_48._0_8_ = this_00;
    iVar5 = std::
            map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
            ::find(&(this->impl).value.entries,&local_38);
    __p = (_Link_type)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
    uVar3 = (_Link_type)iVar5._M_node != __p;
    if ((bool)uVar3) {
      this_01 = (_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                 *)std::_Rb_tree_rebalance_for_erase(iVar5._M_node,(_Rb_tree_node_base *)__p);
      std::
      _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
      ::_M_drop_node(this_01,__p);
      psVar1 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 - 1;
      iVar4 = (**((this->impl).value.clock)->_vptr_Clock)();
      (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar4);
    }
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  else if (sVar6 == 0) {
    uVar3 = 0;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x534,FAILED,(char *)0x0,"\"can\'t remove self from self\"",
               (char (*) [28])"can\'t remove self from self");
    _::Debug::Fault::~Fault((Fault *)local_48);
  }
  else {
    sVar2 = (pSVar8->content).size_;
    if (sVar2 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_48,name,(int)sVar2 + (uint)(sVar2 == 0));
    if ((_func_int **)local_48._8_8_ == (_func_int **)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*(_func_int **)local_48._8_8_ + 0xb0))
                        (local_48._8_8_,pSVar8 + 1,sVar6 - 1);
      (**(code **)(((String *)local_48._0_8_)->content).ptr)
                (local_48._0_8_,local_48._8_8_ + *(long *)(*(_func_int **)local_48._8_8_ + -0x10),
                 extraout_RDX);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't remove self from self") { return false; }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      auto iter = lock->entries.find(path[0]);
      if (iter == lock->entries.end()) {
        return false;
      } else {
        lock->entries.erase(iter);
        lock->modified();
        return true;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], WriteMode::MODIFY)) {
        return child->get()->tryRemove(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }